

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamIGA::ComputeNF
          (ChElementBeamIGA *this,double U,ChVectorDynamic<> *Qi,double *detJ,ChVectorDynamic<> *F,
          ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  uint i;
  double *pdVar2;
  element_type *peVar3;
  double *pdVar4;
  double dVar5;
  int iVar6;
  pointer psVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  char *__function;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ChMatrixDynamic<> N;
  DenseStorage<double,__1,__1,__1,_1> local_58;
  double local_38;
  double local_30;
  
  i = this->order;
  lVar13 = (long)(int)i;
  if ((((-1 < lVar13) &&
       (lVar11 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows, lVar13 < lVar11)) && (lVar9 = (int)~i + lVar11, -1 < lVar9)) &&
     (lVar9 < lVar11)) {
    pdVar2 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    dVar15 = pdVar2[lVar13];
    local_38 = pdVar2[lVar9];
    local_58.m_data = (double *)0x0;
    local_58.m_rows = 0;
    local_58.m_cols = 0;
    iVar6 = (int)((ulong)((long)(this->nodes).
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
    uVar10 = (ulong)iVar6;
    if ((long)uVar10 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    local_30 = U;
    if (uVar10 >> 0x3e != 0 && iVar6 != 0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_58,uVar10 * 2,2,uVar10);
    dVar5 = (local_38 - dVar15) * 0.5;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_30;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (dVar15 + local_38) * 0.5;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar5;
    auVar16 = vfmadd213sd_fma(auVar16,auVar20,auVar18);
    geometry::ChBasisToolsBspline::BasisEvaluateDeriv
              (this->order,i,auVar16._0_8_,&this->knots,(ChMatrixDynamic<> *)&local_58);
    psVar7 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)(this->nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7;
    auVar22 = ZEXT816(0) << 0x40;
    dVar15 = 0.0;
    dVar14 = 0.0;
    auVar21 = ZEXT816(0) << 0x40;
    dVar19 = 0.0;
    if (lVar13 != 0) {
      if (local_58.m_rows < 2) {
LAB_006a2249:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                     );
      }
      lVar13 = lVar13 >> 4;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      lVar11 = 0;
      dVar14 = 0.0;
      do {
        if ((ulong)(~(local_58.m_cols >> 0x3f) & local_58.m_cols) <= lVar13 - 1U) goto LAB_006a2249;
        peVar3 = (psVar7->
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        dVar1 = local_58.m_data[local_58.m_cols + lVar11];
        dVar15 = dVar15 + dVar1 * (((ChCoordsys<double> *)((long)&peVar3->X0 + 8))->pos).m_data[0];
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar15;
        dVar14 = dVar14 + dVar1 * *(double *)((long)&peVar3->X0 + 0x10);
        dVar19 = dVar19 + dVar1 * *(double *)((long)&peVar3->X0 + 0x18);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar19;
        lVar11 = lVar11 + 1;
        psVar7 = psVar7 + 1;
      } while (lVar13 != lVar11);
    }
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar14 * dVar14;
    auVar16 = vfmadd231sd_fma(auVar17,auVar22,auVar22);
    auVar16 = vfmadd231sd_fma(auVar16,auVar21,auVar21);
    if (auVar16._0_8_ < 0.0) {
      dVar15 = sqrt(auVar16._0_8_);
    }
    else {
      auVar16 = vsqrtsd_avx(auVar16,auVar16);
      dVar15 = auVar16._0_8_;
    }
    *detJ = dVar5 * dVar15;
    lVar13 = (long)(this->nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar13 != 0) {
      lVar13 = lVar13 >> 4;
      pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      lVar11 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      pdVar4 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      lVar9 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      lVar12 = 0;
      uVar10 = 0;
      do {
        if ((~(local_58.m_cols * local_58.m_rows >> 0x3f) & local_58.m_cols * local_58.m_rows) ==
            uVar10) {
          __function = 
          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
          ;
          goto LAB_006a2220;
        }
        if (lVar11 < 1) {
LAB_006a222a:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        if (lVar9 <= lVar12) goto LAB_006a220b;
        pdVar4[lVar12] = local_58.m_data[uVar10] * *pdVar2;
        if (lVar11 == 1) goto LAB_006a222a;
        if (lVar9 <= lVar12 + 1) goto LAB_006a220b;
        pdVar4[lVar12 + 1] = local_58.m_data[uVar10] * pdVar2[1];
        if (lVar11 < 3) goto LAB_006a222a;
        if (lVar9 <= lVar12 + 2) goto LAB_006a220b;
        pdVar4[lVar12 + 2] = local_58.m_data[uVar10] * pdVar2[2];
        if (lVar11 == 3) goto LAB_006a222a;
        if (lVar9 <= lVar12 + 3) goto LAB_006a220b;
        pdVar4[lVar12 + 3] = local_58.m_data[uVar10] * pdVar2[3];
        if (lVar11 < 5) goto LAB_006a222a;
        if (lVar9 <= lVar12 + 4) goto LAB_006a220b;
        pdVar4[lVar12 + 4] = local_58.m_data[uVar10] * pdVar2[4];
        if (lVar11 == 5) goto LAB_006a222a;
        if (lVar9 <= lVar12 + 5) goto LAB_006a220b;
        pdVar4[lVar12 + 5] = local_58.m_data[uVar10] * pdVar2[5];
        uVar10 = uVar10 + 1;
        lVar12 = lVar12 + 6;
      } while (lVar13 + (ulong)(lVar13 == 0) != uVar10);
    }
    if (local_58.m_data != (double *)0x0) {
      free((void *)local_58.m_data[-1]);
    }
    return;
  }
LAB_006a220b:
  __function = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
  ;
LAB_006a2220:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,__function);
}

Assistant:

void ChElementBeamIGA::ComputeNF(const double U,
                                 ChVectorDynamic<>& Qi,
                                 double& detJ,
                                 const ChVectorDynamic<>& F,
                                 ChVectorDynamic<>* state_x,
                                 ChVectorDynamic<>* state_w) {
    // get two values of absyssa at extreme of span
    double u1 = knots(order);
    double u2 = knots(knots.size() - order - 1);

    double c1 = (u2 - u1) / 2;
    double c2 = (u2 + u1) / 2;

    // absyssa in span range:
    double u = (c1 * U + c2);

    // compute the basis functions N(u) at given u:
    int nspan = order;

    ChMatrixDynamic<> N(2, (int)nodes.size());  // row n.0 contains N, row n.1 contains dN/du

    geometry::ChBasisToolsBspline::BasisEvaluateDeriv(this->order, nspan, u, knots,
                                                      N);  ///< h

    ChVector<> dr0;
    for (int i = 0; i < nodes.size(); ++i) {
        dr0 += nodes[i]->GetX0ref().coord.pos * N(1, i);
    }
    detJ = dr0.Length() * c1;

    for (int i = 0; i < nodes.size(); ++i) {
        int stride = i * 6;
        Qi(stride + 0) = N(i) * F(0);
        Qi(stride + 1) = N(i) * F(1);
        Qi(stride + 2) = N(i) * F(2);
        Qi(stride + 3) = N(i) * F(3);
        Qi(stride + 4) = N(i) * F(4);
        Qi(stride + 5) = N(i) * F(5);
    }
}